

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::contextMenuEvent
          (QGraphicsScene *this,QGraphicsSceneContextMenuEvent *contextMenuEvent)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *item;
  QGraphicsItemPrivate *this_01;
  QGraphicsItem **ppQVar1;
  bool bVar2;
  QWidget *pQVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QPointF QVar6;
  QPointF local_78;
  QPointF local_68;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  (contextMenuEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_78.xp = (qreal)QGraphicsSceneContextMenuEvent::screenPos(contextMenuEvent);
  QVar6 = QGraphicsSceneContextMenuEvent::scenePos(contextMenuEvent);
  local_68.yp = QVar6.yp;
  local_68.xp = QVar6.xp;
  pQVar3 = QGraphicsSceneEvent::widget(&contextMenuEvent->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            ((QList<QGraphicsItem_*> *)&local_58,this_00,(QPoint *)&local_78,&local_68,pQVar3);
  ppQVar1 = local_58.ptr;
  lVar4 = local_58.size << 3;
  lVar5 = 0;
  while (lVar4 != lVar5) {
    item = *(QGraphicsItem **)((long)ppQVar1 + lVar5);
    this_01 = (item->d_ptr).d;
    QVar6 = QGraphicsSceneContextMenuEvent::scenePos(contextMenuEvent);
    local_78.yp = QVar6.yp;
    local_78.xp = QVar6.xp;
    pQVar3 = QGraphicsSceneEvent::widget(&contextMenuEvent->super_QGraphicsSceneEvent);
    QVar6 = QGraphicsItemPrivate::genericMapFromScene(this_01,&local_78,pQVar3);
    local_68.yp = QVar6.yp;
    local_68.xp = QVar6.xp;
    QGraphicsSceneContextMenuEvent::setPos(contextMenuEvent,&local_68);
    (contextMenuEvent->super_QGraphicsSceneEvent).field_0xc = 1;
    bVar2 = QGraphicsScenePrivate::sendEvent(this_00,item,(QEvent *)contextMenuEvent);
    if ((!bVar2) ||
       (lVar5 = lVar5 + 8, (contextMenuEvent->super_QGraphicsSceneEvent).field_0xc == '\x01'))
    break;
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::contextMenuEvent(QGraphicsSceneContextMenuEvent *contextMenuEvent)
{
    Q_D(QGraphicsScene);
    // Ignore by default.
    contextMenuEvent->ignore();

    // Send the event to all items at this position until one item accepts the
    // event.
    const auto items = d->itemsAtPosition(contextMenuEvent->screenPos(),
                                          contextMenuEvent->scenePos(),
                                          contextMenuEvent->widget());
    for (QGraphicsItem *item : items) {
        contextMenuEvent->setPos(item->d_ptr->genericMapFromScene(contextMenuEvent->scenePos(),
                                                                  contextMenuEvent->widget()));
        contextMenuEvent->accept();
        if (!d->sendEvent(item, contextMenuEvent))
            break;

        if (contextMenuEvent->isAccepted())
            break;
    }
}